

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2FullMatchWithNoArgs(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_c48;
  RE2 local_ac8;
  StringPiece local_9e8;
  LogMessage local_9d8;
  RE2 local_858;
  StringPiece local_778;
  LogMessage local_768;
  RE2 local_5e8;
  StringPiece local_508;
  LogMessage local_4f8;
  RE2 local_378;
  StringPiece local_298;
  LogMessage local_288;
  RE2 local_f8;
  StringPiece local_18;
  
  StringPiece::StringPiece(&local_18,"h");
  RE2::RE2(&local_f8,"h");
  bVar1 = RE2::FullMatch<>(&local_18,&local_f8);
  RE2::~RE2(&local_f8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x241);
    poVar2 = LogMessage::stream(&local_288);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"h\", \"h\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_288);
  }
  StringPiece::StringPiece(&local_298,"hello");
  RE2::RE2(&local_378,"hello");
  bVar1 = RE2::FullMatch<>(&local_298,&local_378);
  RE2::~RE2(&local_378);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x242);
    poVar2 = LogMessage::stream(&local_4f8);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"hello\", \"hello\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4f8);
  }
  StringPiece::StringPiece(&local_508,"hello");
  RE2::RE2(&local_5e8,"h.*o");
  bVar1 = RE2::FullMatch<>(&local_508,&local_5e8);
  RE2::~RE2(&local_5e8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_768,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x243);
    poVar2 = LogMessage::stream(&local_768);
    std::operator<<(poVar2,"Check failed: RE2::FullMatch(\"hello\", \"h.*o\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_768);
  }
  StringPiece::StringPiece(&local_778,"othello");
  RE2::RE2(&local_858,"h.*o");
  bVar1 = RE2::FullMatch<>(&local_778,&local_858);
  RE2::~RE2(&local_858);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_9d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x244);
    poVar2 = LogMessage::stream(&local_9d8);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(\"othello\", \"h.*o\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_9d8);
  }
  StringPiece::StringPiece(&local_9e8,"hello!");
  RE2::RE2(&local_ac8,"h.*o");
  bVar1 = RE2::FullMatch<>(&local_9e8,&local_ac8);
  RE2::~RE2(&local_ac8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c48,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x245);
    poVar2 = LogMessage::stream(&local_c48);
    std::operator<<(poVar2,"Check failed: !RE2::FullMatch(\"hello!\", \"h.*o\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c48);
  }
  return;
}

Assistant:

TEST(RE2, FullMatchWithNoArgs) {
  CHECK(RE2::FullMatch("h", "h"));
  CHECK(RE2::FullMatch("hello", "hello"));
  CHECK(RE2::FullMatch("hello", "h.*o"));
  CHECK(!RE2::FullMatch("othello", "h.*o"));       // Must be anchored at front
  CHECK(!RE2::FullMatch("hello!", "h.*o"));        // Must be anchored at end
}